

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Variance __thiscall
wasm::anon_unknown_24::Inhabitator::getVariance(Inhabitator *this,FieldPos fieldPos)

{
  bool bVar1;
  type *this_00;
  Field *pFVar2;
  byte local_69;
  undefined1 local_60 [8];
  optional<wasm::Field> field;
  type *idx;
  type *type;
  undefined8 local_30;
  Inhabitator *local_28;
  Inhabitator *this_local;
  FieldPos fieldPos_local;
  
  type = (type *)fieldPos.first.id;
  fieldPos_local.first.id._0_4_ = fieldPos.second;
  local_30._4_4_ = fieldPos_local.first.id._4_4_;
  local_30._0_4_ = (uint)fieldPos_local.first.id;
  local_28 = this;
  this_local = (Inhabitator *)type;
  this_00 = std::get<0ul,wasm::HeapType,unsigned_int>((pair<wasm::HeapType,_unsigned_int> *)&type);
  field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Field>._16_8_ =
       std::get<1ul,wasm::HeapType,unsigned_int>((pair<wasm::HeapType,_unsigned_int> *)&type);
  bVar1 = HeapType::isBasic(this_00);
  local_69 = 0;
  if (!bVar1) {
    bVar1 = HeapType::isSignature(this_00);
    local_69 = bVar1 ^ 0xff;
  }
  if ((local_69 & 1) == 0) {
    __assert_fail("!type.isBasic() && !type.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x2c5,
                  "Inhabitator::Variance wasm::(anonymous namespace)::Inhabitator::getVariance(FieldPos)"
                 );
  }
  GCTypeUtils::getField
            ((optional<wasm::Field> *)local_60,(HeapType)this_00->id,
             *(Index *)field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Field>._16_8_);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_60);
  if (!bVar1) {
    __assert_fail("field",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x2c7,
                  "Inhabitator::Variance wasm::(anonymous namespace)::Inhabitator::getVariance(FieldPos)"
                 );
  }
  pFVar2 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_60);
  fieldPos_local._13_3_ = 0;
  fieldPos_local._12_1_ = pFVar2->mutable_ != Mutable;
  return fieldPos_local._12_4_;
}

Assistant:

Inhabitator::Variance Inhabitator::getVariance(FieldPos fieldPos) {
  auto [type, idx] = fieldPos;
  assert(!type.isBasic() && !type.isSignature());
  auto field = GCTypeUtils::getField(type, idx);
  assert(field);
  if (field->mutable_ == Mutable) {
    return Invariant;
  } else {
    return Covariant;
  }
}